

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  bool bVar1;
  byte bVar2;
  CppType CVar3;
  int iVar4;
  LogMessage *pLVar5;
  RepeatedField<int> *this_00;
  RepeatedField<unsigned_long> *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  RepeatedField<long> *this_02;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<bool> *this_04;
  RepeatedField<double> *this_05;
  RepeatedField<float> *this_06;
  string *psVar7;
  Type *pTVar8;
  Type *pTVar9;
  undefined4 extraout_var;
  int64 iVar10;
  Arena *pAVar11;
  int i;
  int index;
  LogFinisher local_71;
  Extension *extension;
  LogMessage local_68;
  
  if (other_extension->is_repeated == true) {
    bVar1 = MaybeNewExtension(this,number,other_extension->descriptor,&extension);
    if (bVar1) {
      extension->type = other_extension->type;
      extension->is_packed = other_extension->is_packed;
      extension->is_repeated = true;
    }
    else {
      if (extension->type != other_extension->type) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37a);
        pLVar5 = LogMessage::operator<<
                           (&local_68,"CHECK failed: (extension->type) == (other_extension.type): ")
        ;
        LogFinisher::operator=(&local_71,pLVar5);
        LogMessage::~LogMessage(&local_68);
      }
      if (extension->is_packed != other_extension->is_packed) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37b);
        pLVar5 = LogMessage::operator<<
                           (&local_68,
                            "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ")
        ;
        LogFinisher::operator=(&local_71,pLVar5);
        LogMessage::~LogMessage(&local_68);
      }
      if (extension->is_repeated == false) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x37c);
        pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: extension->is_repeated: ");
        LogFinisher::operator=(&local_71,pLVar5);
        LogMessage::~LogMessage(&local_68);
      }
    }
    CVar3 = anon_unknown_29::cpp_type(other_extension->type);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_00 = (RepeatedField<int> *)operator_new(0x10);
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          this_00->rep_ = (Rep *)0x0;
        }
        else {
          this_00 = (RepeatedField<int> *)
                    Arena::AllocateAligned(pAVar11,(type_info *)&RepeatedField<int>::typeinfo,0x10);
          RepeatedField<int>::RepeatedField(this_00,pAVar11);
          Arena::AddListNode(pAVar11,this_00,
                             arena_destruct_object<google::protobuf::RepeatedField<int>>);
        }
        (extension->field_0).repeated_int32_value = this_00;
      }
      else {
        this_00 = (extension->field_0).repeated_int32_value;
      }
      RepeatedField<int>::MergeFrom(this_00,(other_extension->field_0).repeated_int32_value);
      return;
    case CPPTYPE_INT64:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_02 = (RepeatedField<long> *)operator_new(0x10);
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          this_02->rep_ = (Rep *)0x0;
        }
        else {
          this_02 = (RepeatedField<long> *)
                    Arena::AllocateAligned(pAVar11,(type_info *)&RepeatedField<long>::typeinfo,0x10)
          ;
          RepeatedField<long>::RepeatedField(this_02,pAVar11);
          Arena::AddListNode(pAVar11,this_02,
                             arena_destruct_object<google::protobuf::RepeatedField<long>>);
        }
        (extension->field_0).repeated_int64_value = this_02;
      }
      else {
        this_02 = (extension->field_0).repeated_int64_value;
      }
      RepeatedField<long>::MergeFrom(this_02,(other_extension->field_0).repeated_int64_value);
      return;
    case CPPTYPE_UINT32:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_03 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          this_03->rep_ = (Rep *)0x0;
        }
        else {
          this_03 = (RepeatedField<unsigned_int> *)
                    Arena::AllocateAligned
                              (pAVar11,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10);
          RepeatedField<unsigned_int>::RepeatedField(this_03,pAVar11);
          Arena::AddListNode(pAVar11,this_03,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
        }
        (extension->field_0).repeated_uint32_value = this_03;
      }
      else {
        this_03 = (extension->field_0).repeated_uint32_value;
      }
      RepeatedField<unsigned_int>::MergeFrom
                (this_03,(other_extension->field_0).repeated_uint32_value);
      return;
    case CPPTYPE_UINT64:
      goto switchD_0033d47c_caseD_4;
    case CPPTYPE_DOUBLE:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_05 = (RepeatedField<double> *)operator_new(0x10);
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          this_05->rep_ = (Rep *)0x0;
        }
        else {
          this_05 = (RepeatedField<double> *)
                    Arena::AllocateAligned
                              (pAVar11,(type_info *)&RepeatedField<double>::typeinfo,0x10);
          RepeatedField<double>::RepeatedField(this_05,pAVar11);
          Arena::AddListNode(pAVar11,this_05,
                             arena_destruct_object<google::protobuf::RepeatedField<double>>);
        }
        (extension->field_0).repeated_double_value = this_05;
      }
      else {
        this_05 = (extension->field_0).repeated_double_value;
      }
      RepeatedField<double>::MergeFrom(this_05,(other_extension->field_0).repeated_double_value);
      return;
    case CPPTYPE_FLOAT:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_06 = (RepeatedField<float> *)operator_new(0x10);
          this_06->current_size_ = 0;
          this_06->total_size_ = 0;
          this_06->rep_ = (Rep *)0x0;
        }
        else {
          this_06 = (RepeatedField<float> *)
                    Arena::AllocateAligned
                              (pAVar11,(type_info *)&RepeatedField<float>::typeinfo,0x10);
          RepeatedField<float>::RepeatedField(this_06,pAVar11);
          Arena::AddListNode(pAVar11,this_06,
                             arena_destruct_object<google::protobuf::RepeatedField<float>>);
        }
        (extension->field_0).repeated_float_value = this_06;
      }
      else {
        this_06 = (extension->field_0).repeated_float_value;
      }
      RepeatedField<float>::MergeFrom(this_06,(other_extension->field_0).repeated_float_value);
      return;
    case CPPTYPE_BOOL:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          this_04 = (RepeatedField<bool> *)operator_new(0x10);
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          this_04->rep_ = (Rep *)0x0;
        }
        else {
          this_04 = (RepeatedField<bool> *)
                    Arena::AllocateAligned(pAVar11,(type_info *)&RepeatedField<bool>::typeinfo,0x10)
          ;
          RepeatedField<bool>::RepeatedField(this_04,pAVar11);
          Arena::AddListNode(pAVar11,this_04,
                             arena_destruct_object<google::protobuf::RepeatedField<bool>>);
        }
        (extension->field_0).repeated_bool_value = this_04;
      }
      else {
        this_04 = (extension->field_0).repeated_bool_value;
      }
      RepeatedField<bool>::MergeFrom(this_04,(other_extension->field_0).repeated_bool_value);
      return;
    case CPPTYPE_STRING:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          psVar7 = (string *)operator_new(0x18);
          (psVar7->_M_dataplus)._M_p = (pointer)0x0;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_allocated_capacity = 0;
        }
        else {
          psVar7 = (string *)
                   Arena::AllocateAligned
                             (pAVar11,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo
                              ,0x18);
          (psVar7->_M_dataplus)._M_p = (pointer)pAVar11;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_allocated_capacity = 0;
          Arena::AddListNode(pAVar11,psVar7,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                            );
        }
        (extension->field_0).repeated_string_value =
             (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)psVar7;
      }
      else {
        psVar7 = (extension->field_0).string_value;
      }
      RepeatedPtrFieldBase::
      MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                ((RepeatedPtrFieldBase *)psVar7,
                 (RepeatedPtrFieldBase *)(other_extension->field_0).string_value);
      return;
    case CPPTYPE_MESSAGE:
      if (bVar1) {
        pAVar11 = this->arena_;
        if (pAVar11 == (Arena *)0x0) {
          pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
          (pRVar6->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
          (pRVar6->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar6->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar6->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
        }
        else {
          pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)Arena::AllocateAligned
                                (pAVar11,(type_info *)
                                         &RepeatedPtrField<google::protobuf::MessageLite>::typeinfo,
                                 0x18);
          (pRVar6->super_RepeatedPtrFieldBase).arena_ = pAVar11;
          (pRVar6->super_RepeatedPtrFieldBase).current_size_ = 0;
          (pRVar6->super_RepeatedPtrFieldBase).total_size_ = 0;
          (pRVar6->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
          Arena::AddListNode(pAVar11,pRVar6,
                             arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                            );
        }
        (extension->field_0).repeated_string_value = pRVar6;
      }
      psVar7 = (other_extension->field_0).string_value;
      for (index = 0; index < (int)psVar7->_M_string_length; index = index + 1) {
        pTVar8 = RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                           ((RepeatedPtrFieldBase *)psVar7,index);
        pTVar9 = RepeatedPtrFieldBase::
                 AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                           ((RepeatedPtrFieldBase *)(extension->field_0).string_value);
        if (pTVar9 == (Type *)0x0) {
          iVar4 = (*pTVar8->_vptr_MessageLite[4])(pTVar8,this->arena_);
          pTVar9 = (Type *)CONCAT44(extraout_var,iVar4);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)(extension->field_0).int64_value,pTVar9);
        }
        (*pTVar9->_vptr_MessageLite[10])(pTVar9,pTVar8);
      }
      return;
    default:
      return;
    }
  }
  if ((other_extension->field_0xa & 1) != 0) {
    return;
  }
  CVar3 = anon_unknown_29::cpp_type(other_extension->type);
  switch(CVar3) {
  case CPPTYPE_INT32:
    SetInt32(this,number,other_extension->type,(other_extension->field_0).int32_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_INT64:
    SetInt64(this,number,other_extension->type,(other_extension->field_0).int64_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_UINT32:
    SetUInt32(this,number,other_extension->type,(other_extension->field_0).uint32_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_UINT64:
    SetUInt64(this,number,other_extension->type,(other_extension->field_0).uint64_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_DOUBLE:
    SetDouble(this,number,other_extension->type,(other_extension->field_0).double_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_FLOAT:
    SetFloat(this,number,other_extension->type,(other_extension->field_0).float_value,
             other_extension->descriptor);
    return;
  case CPPTYPE_BOOL:
    SetBool(this,number,other_extension->type,(other_extension->field_0).bool_value,
            other_extension->descriptor);
    return;
  case CPPTYPE_ENUM:
    SetEnum(this,number,other_extension->type,(other_extension->field_0).enum_value,
            other_extension->descriptor);
    return;
  case CPPTYPE_STRING:
    SetString(this,number,other_extension->type,(other_extension->field_0).string_value,
              other_extension->descriptor);
    return;
  case CPPTYPE_MESSAGE:
    goto switchD_0033d352_caseD_a;
  default:
    return;
  }
switchD_0033d47c_caseD_4:
  if (bVar1) {
    pAVar11 = this->arena_;
    if (pAVar11 == (Arena *)0x0) {
      this_01 = (RepeatedField<unsigned_long> *)operator_new(0x10);
      this_01->current_size_ = 0;
      this_01->total_size_ = 0;
      this_01->rep_ = (Rep *)0x0;
    }
    else {
      this_01 = (RepeatedField<unsigned_long> *)
                Arena::AllocateAligned
                          (pAVar11,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
      RepeatedField<unsigned_long>::RepeatedField(this_01,pAVar11);
      Arena::AddListNode(pAVar11,this_01,
                         arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
    }
    (extension->field_0).repeated_uint64_value = this_01;
  }
  else {
    this_01 = (extension->field_0).repeated_uint64_value;
  }
  RepeatedField<unsigned_long>::MergeFrom(this_01,(other_extension->field_0).repeated_uint64_value);
  return;
switchD_0033d352_caseD_a:
  bVar1 = MaybeNewExtension(this,number,other_extension->descriptor,&extension);
  if (bVar1) {
    extension->type = other_extension->type;
    extension->is_packed = other_extension->is_packed;
    extension->is_repeated = false;
    bVar2 = extension->field_0xa & 0xf;
    if ((other_extension->field_0xa & 0x10) != 0) {
      extension->field_0xa = bVar2 | 0x10;
      pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(**(code **)((((other_extension->field_0).repeated_string_value)->
                               super_RepeatedPtrFieldBase).arena_ + 0x10))
                            ((other_extension->field_0).repeated_string_value,this->arena_);
      (extension->field_0).repeated_string_value = pRVar6;
      (**(code **)((pRVar6->super_RepeatedPtrFieldBase).arena_ + 0x60))
                (pRVar6,(other_extension->field_0).int64_value);
      goto LAB_0033dbe5;
    }
    extension->field_0xa = bVar2;
    pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(**(code **)((((other_extension->field_0).repeated_string_value)->
                             super_RepeatedPtrFieldBase).arena_ + 0x20))
                          ((other_extension->field_0).repeated_string_value,this->arena_);
    (extension->field_0).repeated_string_value = pRVar6;
LAB_0033dbd9:
    iVar10 = (other_extension->field_0).int64_value;
    pAVar11 = (pRVar6->super_RepeatedPtrFieldBase).arena_;
  }
  else {
    if (extension->type != other_extension->type) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3d9);
      pLVar5 = LogMessage::operator<<
                         (&local_68,"CHECK failed: (extension->type) == (other_extension.type): ");
      LogFinisher::operator=(&local_71,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    if (extension->is_packed != other_extension->is_packed) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3da);
      pLVar5 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (extension->is_packed) == (other_extension.is_packed): ");
      LogFinisher::operator=(&local_71,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    if (extension->is_repeated == true) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3db);
      pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: !extension->is_repeated: ");
      LogFinisher::operator=(&local_71,pLVar5);
      LogMessage::~LogMessage(&local_68);
    }
    pRVar6 = (extension->field_0).repeated_string_value;
    if ((other_extension->field_0xa & 0x10) == 0) {
      pAVar11 = (pRVar6->super_RepeatedPtrFieldBase).arena_;
      if ((extension->field_0xa & 0x10) == 0) {
        (**(code **)(pAVar11 + 0x50))();
        goto LAB_0033dbe5;
      }
      pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(**(code **)(pAVar11 + 0x20))(pRVar6);
      goto LAB_0033dbd9;
    }
    if ((extension->field_0xa & 0x10) != 0) {
      (**(code **)((pRVar6->super_RepeatedPtrFieldBase).arena_ + 0x60))(pRVar6);
      goto LAB_0033dbe5;
    }
    iVar10 = (**(code **)((((other_extension->field_0).repeated_string_value)->
                          super_RepeatedPtrFieldBase).arena_ + 0x18))
                       ((other_extension->field_0).repeated_string_value,pRVar6);
    pAVar11 = (pRVar6->super_RepeatedPtrFieldBase).arena_;
  }
  (**(code **)(pAVar11 + 0x50))(pRVar6,iVar10);
LAB_0033dbe5:
  extension->field_0xa = extension->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
  int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new = MaybeNewExtension(number, other_extension.descriptor,
                                    &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)                    \
      case WireFormatLite::CPPTYPE_##UPPERCASE:                             \
        if (is_new) {                                                       \
          extension->repeated_##LOWERCASE##_value =                         \
            Arena::CreateMessage<REPEATED_TYPE >(arena_);                   \
        }                                                                   \
        extension->repeated_##LOWERCASE##_value->MergeFrom(                 \
          *other_extension.repeated_##LOWERCASE##_value);                   \
        break;

      HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
      HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
      HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
      HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
      HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
      HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
      HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
      HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
      HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target = extension->repeated_message_value
                   ->AddFromCleared<GenericTypeHandler<MessageLite> >();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                       \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
          Set##CAMELCASE(number, other_extension.type,                     \
                         other_extension.LOWERCASE##_value,                \
                         other_extension.descriptor);                      \
          break;

        HANDLE_TYPE( INT32,  int32,  Int32);
        HANDLE_TYPE( INT64,  int64,  Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE( FLOAT,  float,  Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(  BOOL,   bool,   Bool);
        HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type,
                    *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new = MaybeNewExtension(number,
                                          other_extension.descriptor,
                                          &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value->MutableMessage(
                    *other_extension.message_value)->CheckTypeAndMergeFrom(
                        *other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}